

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

string * StripExtension(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  size_t i;
  string *filename_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filename,0x15a45e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripExtension(const std::string &filename) {
  size_t i = filename.find_last_of(".");
  return i != std::string::npos ? filename.substr(0, i) : filename;
}